

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

char * escape_string(Curl_easy *data,char *src,mimestrategy strategy)

{
  char cVar1;
  CURLcode CVar2;
  char *pcVar3;
  char **ppcVar4;
  char **ppcVar5;
  bool bVar6;
  dynbuf db;
  dynbuf local_40;
  
  if ((strategy == MIMESTRATEGY_MAIL) ||
     ((ppcVar5 = escape_string::formtable, data != (Curl_easy *)0x0 &&
      (((data->set).field_0x8ca & 1) != 0)))) {
    ppcVar5 = escape_string::mimetable;
  }
  Curl_dyn_init(&local_40,8000000);
  CVar2 = Curl_dyn_addn(&local_40,"",0);
  if (CVar2 == CURLE_OK) {
    do {
      if (*src == '\0') break;
      pcVar3 = *ppcVar5;
      bVar6 = pcVar3 == (char *)0x0;
      if (bVar6) {
LAB_00140c98:
        CVar2 = Curl_dyn_addn(&local_40,src,1);
      }
      else {
        cVar1 = *pcVar3;
        ppcVar4 = ppcVar5;
        while (cVar1 != *src) {
          ppcVar4 = ppcVar4 + 1;
          pcVar3 = *ppcVar4;
          bVar6 = pcVar3 == (char *)0x0;
          if (bVar6) goto LAB_00140c98;
          cVar1 = *pcVar3;
        }
        if (bVar6) goto LAB_00140c98;
        CVar2 = Curl_dyn_add(&local_40,pcVar3 + 1);
      }
      src = src + 1;
    } while (CVar2 == CURLE_OK);
  }
  pcVar3 = Curl_dyn_ptr(&local_40);
  return pcVar3;
}

Assistant:

static char *escape_string(struct Curl_easy *data,
                           const char *src, enum mimestrategy strategy)
{
  CURLcode result;
  struct dynbuf db;
  const char * const *table;
  const char * const *p;
  /* replace first character by rest of string. */
  static const char * const mimetable[] = {
    "\\\\\\",
    "\"\\\"",
    NULL
  };
  /* WHATWG HTML living standard 4.10.21.8 2 specifies:
     For field names and filenames for file fields, the result of the
     encoding in the previous bullet point must be escaped by replacing
     any 0x0A (LF) bytes with the byte sequence `%0A`, 0x0D (CR) with `%0D`
     and 0x22 (") with `%22`.
     The user agent must not perform any other escapes. */
  static const char * const formtable[] = {
    "\"%22",
    "\r%0D",
    "\n%0A",
    NULL
  };

  table = formtable;
  /* data can be NULL when this function is called indirectly from
     curl_formget(). */
  if(strategy == MIMESTRATEGY_MAIL || (data && (data->set.mime_formescape)))
    table = mimetable;

  Curl_dyn_init(&db, CURL_MAX_INPUT_LENGTH);

  for(result = Curl_dyn_addn(&db, STRCONST("")); !result && *src; src++) {
    for(p = table; *p && **p != *src; p++)
      ;

    if(*p)
      result = Curl_dyn_add(&db, *p + 1);
    else
      result = Curl_dyn_addn(&db, src, 1);
  }

  return Curl_dyn_ptr(&db);
}